

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::setupElementTransformWidget(Application *this)

{
  int iVar1;
  Action AVar2;
  XFormWidget *pXVar3;
  SceneObject *pSVar4;
  long lVar5;
  long lVar6;
  Scene *pSVar7;
  XFormWidget *this_00;
  
  iVar1 = *(int *)&(this->super_Renderer).field_0xc;
  if (iVar1 == 2) {
    AVar2 = this->action;
    if (AVar2 == Pose) {
      DynamicScene::XFormWidget::enterObjectMode(this->scene->elementTransform);
      DynamicScene::XFormWidget::exitTransformedMode(this->scene->elementTransform);
      pSVar7 = this->scene;
      pXVar3 = (XFormWidget *)(pSVar7->selected).object;
      if (pXVar3 == (XFormWidget *)0x0) {
        return;
      }
      if (pXVar3 == pSVar7->elementTransform) {
        return;
      }
      DynamicScene::XFormWidget::setTarget(pSVar7->elementTransform,&pSVar7->selected);
      DynamicScene::Scene::addObject(this->scene,&this->scene->elementTransform->super_SceneObject);
      pSVar7 = this->scene;
      pSVar4 = (pSVar7->selected).object;
      if ((pSVar4 == (SceneObject *)0x0) ||
         (lVar6 = __dynamic_cast(pSVar4,&DynamicScene::SceneObject::typeinfo,
                                 &DynamicScene::Joint::typeinfo,0), lVar6 == 0)) {
        DynamicScene::XFormWidget::exitPoseMode(pSVar7->elementTransform);
      }
      else {
        lVar5 = *(long *)(*(long *)(lVar6 + 0x140) + 0xf8);
        DynamicScene::XFormWidget::enterPoseMode(pSVar7->elementTransform);
        pXVar3 = this->scene->elementTransform;
        if (lVar6 == lVar5) {
          DynamicScene::XFormWidget::setTranslate(pXVar3);
        }
        else {
          DynamicScene::XFormWidget::setRotate(pXVar3);
        }
      }
      DynamicScene::XFormWidget::updateGeometry(this->scene->elementTransform);
      return;
    }
    if (AVar2 == Object) {
      DynamicScene::XFormWidget::enterObjectMode(this->scene->elementTransform);
      DynamicScene::XFormWidget::exitPoseMode(this->scene->elementTransform);
      DynamicScene::XFormWidget::exitTransformedMode(this->scene->elementTransform);
      pSVar7 = this->scene;
      pXVar3 = (XFormWidget *)(pSVar7->selected).object;
      if (pXVar3 == (XFormWidget *)0x0) {
        return;
      }
      this_00 = pSVar7->elementTransform;
      if (pXVar3 == this_00) {
        return;
      }
      goto LAB_001952c5;
    }
    if (AVar2 != Wave) {
      return;
    }
    DynamicScene::XFormWidget::exitObjectMode(this->scene->elementTransform);
    DynamicScene::XFormWidget::exitPoseMode(this->scene->elementTransform);
    DynamicScene::XFormWidget::enterTransformedMode(this->scene->elementTransform);
  }
  else {
    if (iVar1 != 0) {
      return;
    }
    DynamicScene::XFormWidget::exitObjectMode(this->scene->elementTransform);
    DynamicScene::XFormWidget::exitTransformedMode(this->scene->elementTransform);
    DynamicScene::XFormWidget::exitPoseMode(this->scene->elementTransform);
  }
  pSVar7 = this->scene;
  if (((pSVar7->selected).element == (HalfedgeElement *)0x0) ||
     (this_00 = pSVar7->elementTransform, (XFormWidget *)(pSVar7->selected).object == this_00)) {
    return;
  }
LAB_001952c5:
  DynamicScene::XFormWidget::setTarget(this_00,&pSVar7->selected);
  DynamicScene::Scene::addObject(this->scene,&this->scene->elementTransform->super_SceneObject);
  return;
}

Assistant:

void Application::setupElementTransformWidget() {
  switch (mode) {
    case RENDER_MODE:
    case VISUALIZE_MODE:
      break;
    case MODEL_MODE:
      scene->elementTransform->exitObjectMode();
      scene->elementTransform->exitTransformedMode();
      scene->elementTransform->exitPoseMode();
      if (scene->selected.element != nullptr  && scene->selected.object != scene->elementTransform) {
        scene->elementTransform->setTarget(scene->selected);
        scene->addObject(scene->elementTransform);
      }
      break;
    case ANIMATE_MODE:
      if (action == Action::Wave) {
        scene->elementTransform->exitObjectMode();
        scene->elementTransform->exitPoseMode();
        scene->elementTransform->enterTransformedMode();
        if (scene->selected.element != nullptr && scene->selected.object != scene->elementTransform) {
          scene->elementTransform->setTarget(scene->selected);
          scene->addObject(scene->elementTransform);
        }
      } else if (action == Action::Object) {
        scene->elementTransform->enterObjectMode();
        scene->elementTransform->exitPoseMode();
        scene->elementTransform->exitTransformedMode();
        if (scene->selected.object != nullptr && scene->selected.object != scene->elementTransform) {
          scene->elementTransform->setTarget(scene->selected);
          scene->addObject(scene->elementTransform);
        }
      } else if (action == Action::Pose) {
        scene->elementTransform->enterObjectMode();
        scene->elementTransform->exitTransformedMode();
        if (scene->selected.object != nullptr && scene->selected.object != scene->elementTransform) {
          scene->elementTransform->setTarget(scene->selected);
          scene->addObject(scene->elementTransform);

          DynamicScene::Joint *joint =
              dynamic_cast<DynamicScene::Joint *>(scene->selected.object);

          if (joint != nullptr) {
            bool isRoot = joint == joint->skeleton->root;
            scene->elementTransform->enterPoseMode();
            if (isRoot)
              // Only allow root translation
              scene->elementTransform->setTranslate();
            else
              // Other joints are only allowed to be rotated
              scene->elementTransform->setRotate();
          } else {
            scene->elementTransform->exitPoseMode();
          }

          scene->elementTransform->updateGeometry(); // enterPoseMode affects updateGeometry
        }
      }
      break;
  }
}